

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

void __thiscall Face::turn_face(Face *this,Direction dir)

{
  int local_9c;
  int local_98;
  int i;
  int turn_map [16];
  Color color_tmp [16];
  Direction dir_local;
  Face *this_local;
  
  memcpy(turn_map + 0xe,this->color_data,0x40);
  if (dir == clockwise) {
    memcpy(&local_98,this->cw_rotation,0x40);
  }
  else {
    memcpy(&local_98,this->ccw_rotation,0x40);
  }
  for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
    this->color_data[local_9c] = turn_map[(long)(&local_98)[local_9c] + 0xe];
  }
  return;
}

Assistant:

void Face::turn_face(Direction dir){
    Color color_tmp[16];
    std::memcpy(color_tmp, color_data, 16*sizeof(Color));
    int turn_map[16];
    if(dir == Direction::clockwise){
        std::memcpy(turn_map, cw_rotation, 16*sizeof(int));
    }
    else{
        std::memcpy(turn_map, ccw_rotation, 16*sizeof(int));
    }
    for(int i = 0; i < 16; i++){
        color_data[i] = color_tmp[turn_map[i]];
    }
}